

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9HashmapUnion(jx9_hashmap *pLeft,jx9_hashmap *pRight)

{
  sxi32 sVar1;
  int iVar2;
  jx9_value *pjVar3;
  uint local_3c;
  sxu32 n;
  jx9_value *pObj;
  jx9_hashmap_node *pjStack_28;
  sxi32 rc;
  jx9_hashmap_node *pEntry;
  jx9_hashmap *pRight_local;
  jx9_hashmap *pLeft_local;
  
  if (pLeft != pRight) {
    pjStack_28 = pRight->pFirst;
    for (local_3c = 0; local_3c < pRight->nEntry; local_3c = local_3c + 1) {
      if (pjStack_28->iType == 2) {
        sVar1 = HashmapLookupBlobKey
                          (pLeft,(pjStack_28->xKey).sKey.pBlob,(pjStack_28->xKey).sKey.nByte,
                           (jx9_hashmap_node **)0x0);
        if ((sVar1 != 0) &&
           (pjVar3 = HashmapExtractNodeValue(pjStack_28), pjVar3 != (jx9_value *)0x0)) {
          iVar2 = HashmapInsertBlobKey
                            (pLeft,(pjStack_28->xKey).sKey.pBlob,(pjStack_28->xKey).sKey.nByte,
                             pjVar3);
joined_r0x0012e5d5:
          if (iVar2 != 0) {
            return iVar2;
          }
        }
      }
      else {
        sVar1 = HashmapLookupIntKey(pLeft,(pjStack_28->xKey).iKey,(jx9_hashmap_node **)0x0);
        if ((sVar1 != 0) &&
           (pjVar3 = HashmapExtractNodeValue(pjStack_28), pjVar3 != (jx9_value *)0x0)) {
          iVar2 = HashmapInsertIntKey(pLeft,(pjStack_28->xKey).iKey,pjVar3);
          goto joined_r0x0012e5d5;
        }
      }
      pjStack_28 = pjStack_28->pPrev;
    }
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapUnion(jx9_hashmap *pLeft, jx9_hashmap *pRight)
{
	jx9_hashmap_node *pEntry;
	sxi32 rc = SXRET_OK;
	jx9_value *pObj;
	sxu32 n;
	if( pLeft == pRight ){
		/* Same map. This can easily happen since hashmaps are passed by reference.
		 * Unlike the  engine.
		 */
		return SXRET_OK;
	}
	/* Perform the union */
	pEntry = pRight->pFirst;
	for(n = 0 ; n < pRight->nEntry ; ++n ){
		/* Make sure the given key does not exists in the left array */
		if( pEntry->iType == HASHMAP_BLOB_NODE ){
			/* BLOB key */
			if( SXRET_OK != 
				HashmapLookupBlobKey(&(*pLeft), SyBlobData(&pEntry->xKey.sKey), SyBlobLength(&pEntry->xKey.sKey), 0) ){
					pObj = HashmapExtractNodeValue(pEntry);
					if( pObj ){
						/* Perform the insertion */
						rc = HashmapInsertBlobKey(&(*pLeft), SyBlobData(&pEntry->xKey.sKey),
							SyBlobLength(&pEntry->xKey.sKey),pObj);
						if( rc != SXRET_OK ){
							return rc;
						}
					}
			}
		}else{
			/* INT key */
			if( SXRET_OK != HashmapLookupIntKey(&(*pLeft), pEntry->xKey.iKey, 0) ){
				pObj = HashmapExtractNodeValue(pEntry);
				if( pObj ){
					/* Perform the insertion */
					rc = HashmapInsertIntKey(&(*pLeft), pEntry->xKey.iKey, pObj);
					if( rc != SXRET_OK ){
						return rc;
					}
				}
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	return SXRET_OK;
}